

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool rcg::loadStreamableParameters
               (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception)

{
  CFeatureBag bag;
  ifstream in;
  
  GenApi_3_4::CFeatureBag::CFeatureBag(&bag);
  std::ifstream::ifstream(&in);
  std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in + -0x18));
  std::ifstream::open((char *)&in,(_Ios_Openmode)name);
  GenApi_3_4::operator>>((istream *)&in,&bag);
  std::ifstream::close();
  GenApi_3_4::CFeatureBag::LoadFromBag
            ((INodeMap *)&bag,
             SUB81((((nodemap->
                     super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,0),
             (gcstring_vector *)0x1);
  std::ifstream::~ifstream(&in);
  GenApi_3_4::CFeatureBag::~CFeatureBag(&bag);
  return true;
}

Assistant:

bool loadStreamableParameters(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  bool exception)
{
  bool ret=false;

  try
  {
    GenApi::CFeatureBag bag;

    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    in.open(name);
    in >> bag;
    in.close();

    bag.LoadFromBag(nodemap->_Ptr, true);

    ret=true;
  }
  catch (const std::exception &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}